

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

wstring * __thiscall
mjs::do_format_double_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double m,int k)

{
  int iVar1;
  wostream *pwVar2;
  long lVar3;
  size_t sVar4;
  allocator<wchar_t> local_259;
  wstring local_258 [39];
  allocator<wchar_t> local_231;
  wstring local_230 [39];
  allocator<wchar_t> local_209;
  wstring local_208 [39];
  allocator<wchar_t> local_1e1;
  wstring local_1e0 [48];
  wostringstream local_1b0 [8];
  wostringstream woss;
  undefined1 local_38 [8];
  int k_;
  int local_1c;
  double dStack_18;
  int k_local;
  double m_local;
  
  local_1c = (int)this;
  dStack_18 = m;
  m_local = (double)__return_storage_ptr__;
  anon_unknown_1::do_ecvt((ecvt_result *)local_38,m,local_1c);
  std::__cxx11::wostringstream::wostringstream(local_1b0);
  if (((int)local_38._4_4_ < local_1c) || (0x15 < (int)local_38._4_4_)) {
    if (((int)local_38._4_4_ < 1) || (0x15 < (int)local_38._4_4_)) {
      if (((int)local_38._4_4_ < -5) || (0 < (int)local_38._4_4_)) {
        if (local_1c == 1) {
          pwVar2 = std::operator<<((wostream *)local_1b0,(char *)&k_);
          pwVar2 = std::operator<<(pwVar2,'e');
          pwVar2 = std::operator<<(pwVar2,(char)(local_38._4_4_ + -1 >> 0x1f) * -2 + '+');
          iVar1 = local_38._4_4_ + -1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          std::wostream::operator<<(pwVar2,iVar1);
        }
        else {
          pwVar2 = std::operator<<((wostream *)local_1b0,(char)k_);
          pwVar2 = std::operator<<(pwVar2,'.');
          pwVar2 = std::operator<<(pwVar2,(char *)((long)&k_ + 1));
          pwVar2 = std::operator<<(pwVar2,'e');
          pwVar2 = std::operator<<(pwVar2,(char)(local_38._4_4_ + -1 >> 0x1f) * -2 + '+');
          iVar1 = local_38._4_4_ + -1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          std::wostream::operator<<(pwVar2,iVar1);
        }
      }
      else {
        pwVar2 = std::operator<<((wostream *)local_1b0,"0.");
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  (local_258,(long)(int)-local_38._4_4_,L'0',&local_259);
        pwVar2 = std::operator<<(pwVar2,local_258);
        std::operator<<(pwVar2,(char *)&k_);
        std::__cxx11::wstring::~wstring(local_258);
        std::allocator<wchar_t>::~allocator(&local_259);
      }
    }
    else {
      lVar3 = (long)(int)local_38._4_4_;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<char*,void>
                (local_208,(char *)&k_,(char *)((long)&k_ + lVar3),&local_209);
      pwVar2 = std::operator<<((wostream *)local_1b0,local_208);
      pwVar2 = std::operator<<(pwVar2,'.');
      sVar4 = strlen((char *)&k_);
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<char*,void>
                (local_230,(char *)((long)&k_ + (long)(int)local_38._4_4_),
                 (char *)((long)&k_ + sVar4),&local_231);
      std::operator<<(pwVar2,local_230);
      std::__cxx11::wstring::~wstring(local_230);
      std::allocator<wchar_t>::~allocator(&local_231);
      std::__cxx11::wstring::~wstring(local_208);
      std::allocator<wchar_t>::~allocator(&local_209);
    }
  }
  else {
    pwVar2 = std::operator<<((wostream *)local_1b0,(char *)&k_);
    iVar1 = local_38._4_4_ - local_1c;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1e0,(long)iVar1,L'0',&local_1e1);
    std::operator<<(pwVar2,local_1e0);
    std::__cxx11::wstring::~wstring(local_1e0);
    std::allocator<wchar_t>::~allocator(&local_1e1);
  }
  std::__cxx11::wostringstream::str();
  std::__cxx11::wostringstream::~wostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::wstring do_format_double(double m, int k) {
    auto [k_, n, s] = do_ecvt(m, k); (void)k_;

    std::wostringstream woss;
    if (k <= n && n <= 21) {
        // 6. If k <= n <= 21, return the string consisting of the k digits of the decimal
        // representation of s (in order, with no leading zeroes), followed by n - k
        // occurences of the character �0�
        woss << s << std::wstring(n-k, '0');
    } else if (0 < n && n <= 21) {
        // 7. If 0 < n <= 21, return the string consisting of the most significant n digits
        // of the decimal representation of s, followed by a decimal point �.�, followed
        // by the remaining k - n digits of the decimal representation of s.
        woss << std::wstring(s, s + n) << '.' << std::wstring(s + n, s + std::strlen(s));
    } else if (-6 < n && n <= 0) {
        // 8. If -6 < n <= 0, return the string consisting of the character �0�, followed
        // by a decimal point �.�, followed by -n occurences of the character �0�, followed
        // by the k digits of the decimal representation of s.
        woss << "0." << std::wstring(-n, '0') << s;
    } else if (k == 1) {
        // 9.  Otherwise, if k = 1, return the string consisting of the single digit of s,
        // followed by lowercase character �e�, followed by a plus sign �+� or minus sign
        // �-� according to whether n - 1 is positive or negative, followed by the decimal
        // representation of the integer abs(n - 1) (with no leading zeros).
        woss << s << 'e' << (n-1>=0?'+':'-') << std::abs(n-1);
    } else {
        // 10. Return the string consisting of the most significant digit of the decimal
        // representation of s, followed by a decimal point �.�, followed by the remaining
        // k - 1 digits of the decimal representation of s , followed by the lowercase character
        // �e�, followed by a plus sign �+� or minus sign �-� according to whether n - 1 is positive
        // or negative, followed by the decimal representation of the integer abs(n - 1)
        // (with no leading zeros)
        woss << s[0] << '.' << s+1 << 'e' << (n-1>=0?'+':'-') << std::abs(n-1);
    }
    return woss.str();
}